

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

uint8_t __thiscall
GmmLib::GmmResourceInfoCommon::GetSetHardwareProtection
          (GmmResourceInfoCommon *this,uint8_t GetIsEncrypted,uint8_t SetIsEncrypted)

{
  byte local_13;
  uint8_t IsEncrypted;
  uint8_t SetIsEncrypted_local;
  uint8_t GetIsEncrypted_local;
  GmmResourceInfoCommon *this_local;
  
  if (GetIsEncrypted == '\0') {
    (this->Surf).Flags.Info =
         (anon_struct_8_44_94931171_for_Info)
         ((ulong)(this->Surf).Flags.Info & 0xffffffffffffdfff | ((ulong)SetIsEncrypted & 1) << 0xd);
    local_13 = SetIsEncrypted;
  }
  else {
    local_13 = (byte)((ulong)(this->Surf).Flags.Info >> 0xd) & 1;
  }
  return local_13;
}

Assistant:

virtual GMM_INLINE_EXPORTED uint8_t GMM_STDCALL GetSetHardwareProtection(uint8_t GetIsEncrypted, uint8_t SetIsEncrypted)
            {
                uint8_t IsEncrypted = 0;

                if (GetIsEncrypted)
                {
                    IsEncrypted = Surf.Flags.Info.HardwareProtected;
                }
                else
                {
                    Surf.Flags.Info.HardwareProtected = IsEncrypted = SetIsEncrypted;
                }

                return IsEncrypted;
            }